

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cc
# Opt level: O2

int OpenConfigAndCountWords(void)

{
  istream *piVar1;
  int iVar2;
  allocator local_39;
  ThreadCapture<FileFactory> local_38;
  string sink;
  
  std::__cxx11::string::string((string *)&sink,"CMakeLists.txt",&local_39);
  FileFactory::ReadFile((FileFactory *)&local_38,&sink);
  std::__cxx11::string::~string((string *)&sink);
  if ((istream *)local_38._vptr_ThreadCapture == (istream *)0x0) {
    iVar2 = -1;
  }
  else {
    sink._M_dataplus._M_p = (pointer)&sink.field_2;
    sink._M_string_length = 0;
    sink.field_2._M_local_buf[0] = '\0';
    iVar2 = 0;
    while( true ) {
      piVar1 = std::operator>>((istream *)local_38._vptr_ThreadCapture,(string *)&sink);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      iVar2 = iVar2 + 1;
    }
    std::__cxx11::string::~string((string *)&sink);
    if ((istream *)local_38._vptr_ThreadCapture != (istream *)0x0) {
      (**(code **)(*local_38._vptr_ThreadCapture + 8))();
    }
  }
  return iVar2;
}

Assistant:

int OpenConfigAndCountWords() {
  const auto input = FileFactory::ReadFile("CMakeLists.txt");
  if (!input) {
    return -1;
  } else {
    int count = 0;
    std::string sink;
    while ((*input >> sink)) {
      ++count;
    }
    return count;
  }
}